

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

void secp256k1_ellswift_xswiftec_frac_var
               (secp256k1_fe *xn,secp256k1_fe *xd,secp256k1_fe *u,secp256k1_fe *t)

{
  int iVar1;
  secp256k1_fe n;
  secp256k1_fe s;
  secp256k1_fe u1;
  secp256k1_fe p;
  secp256k1_fe g;
  secp256k1_fe l;
  secp256k1_fe d;
  
  u1.n[0] = u->n[0];
  u1.n[1] = u->n[1];
  u1.n[2] = u->n[2];
  u1.n[3] = u->n[3];
  u1.n[4] = u->n[4];
  u1.magnitude = u->magnitude;
  u1.normalized = u->normalized;
  iVar1 = secp256k1_fe_normalizes_to_zero_var(&u1);
  if (iVar1 != 0) {
    u1.n[4] = 0;
    u1.magnitude = 1;
    u1.normalized = 1;
    u1.n[2] = 0;
    u1.n[3] = 0;
    u1.n[0] = 1;
    u1.n[1] = 0;
  }
  secp256k1_fe_sqr(&s,t);
  iVar1 = secp256k1_fe_normalizes_to_zero_var(t);
  if (iVar1 != 0) {
    s.n[4] = 0;
    s.magnitude = 1;
    s.normalized = 1;
    s.n[2] = 0;
    s.n[3] = 0;
    s.n[0] = 1;
    s.n[1] = 0;
  }
  secp256k1_fe_sqr(&l,&u1);
  secp256k1_fe_mul(&g,&l,&u1);
  secp256k1_fe_add_int(&g,2);
  p.n[4] = g.n[4];
  p.magnitude = g.magnitude;
  p.normalized = g.normalized;
  p.n[2] = g.n[2];
  p.n[3] = g.n[3];
  p.n[0] = g.n[0];
  p.n[1] = g.n[1];
  secp256k1_fe_add(&p,&s);
  iVar1 = secp256k1_fe_normalizes_to_zero_var(&p);
  if (iVar1 != 0) {
    secp256k1_fe_mul_int_unchecked(&s,4);
    p.n[4] = g.n[4];
    p.magnitude = g.magnitude;
    p.normalized = g.normalized;
    p.n[2] = g.n[2];
    p.n[3] = g.n[3];
    p.n[0] = g.n[0];
    p.n[1] = g.n[1];
    secp256k1_fe_add(&p,&s);
  }
  secp256k1_fe_mul(&d,&s,&l);
  secp256k1_fe_mul_int_unchecked(&d,3);
  secp256k1_fe_sqr(&l,&p);
  secp256k1_fe_negate_unchecked(&l,&l,1);
  secp256k1_fe_mul(&n,&d,&u1);
  secp256k1_fe_add(&n,&l);
  iVar1 = secp256k1_ge_x_frac_on_curve_var(&n,&d);
  if (iVar1 == 0) {
    xd->n[4] = p.n[4];
    xd->magnitude = p.magnitude;
    xd->normalized = p.normalized;
    xd->n[2] = p.n[2];
    xd->n[3] = p.n[3];
    xd->n[0] = p.n[0];
    xd->n[1] = p.n[1];
    secp256k1_fe_mul(&l,&secp256k1_ellswift_c1,&s);
    secp256k1_fe_mul(&n,&secp256k1_ellswift_c2,&g);
    secp256k1_fe_add(&n,&l);
    secp256k1_fe_mul(&n,&n,&u1);
    iVar1 = secp256k1_ge_x_frac_on_curve_var(&n,&p);
    if (iVar1 == 0) {
      secp256k1_fe_mul(&l,&p,&u1);
      secp256k1_fe_add(&n,&l);
      secp256k1_fe_negate_unchecked(xn,&n,2);
      iVar1 = secp256k1_ge_x_frac_on_curve_var(xn,&p);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/modules/ellswift/main_impl.h"
                ,0x82,"test condition failed: secp256k1_ge_x_frac_on_curve_var(xn, &p)");
        abort();
      }
    }
    else {
      xn->n[4] = n.n[4];
      xn->magnitude = n.magnitude;
      xn->normalized = n.normalized;
      xn->n[2] = n.n[2];
      xn->n[3] = n.n[3];
      xn->n[0] = n.n[0];
      xn->n[1] = n.n[1];
    }
  }
  else {
    xn->n[4] = n.n[4];
    xn->magnitude = n.magnitude;
    xn->normalized = n.normalized;
    xn->n[2] = n.n[2];
    xn->n[3] = n.n[3];
    xn->n[0] = n.n[0];
    xn->n[1] = n.n[1];
    xd->n[4] = d.n[4];
    xd->magnitude = d.magnitude;
    xd->normalized = d.normalized;
    xd->n[2] = d.n[2];
    xd->n[3] = d.n[3];
    xd->n[0] = d.n[0];
    xd->n[1] = d.n[1];
  }
  return;
}

Assistant:

static void secp256k1_ellswift_xswiftec_frac_var(secp256k1_fe *xn, secp256k1_fe *xd, const secp256k1_fe *u, const secp256k1_fe *t) {
    /* The implemented algorithm is the following (all operations in GF(p)):
     *
     * - Let c0 = sqrt(-3) = 0xa2d2ba93507f1df233770c2a797962cc61f6d15da14ecd47d8d27ae1cd5f852.
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - If u^3+7+t^2 = 0, set t = 2*t.
     * - Let X = (u^3+7-t^2)/(2*t).
     * - Let Y = (X+t)/(c0*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = (X/Y-u)/2 (which is now guaranteed to be a valid x coordinate).
     *
     * Introducing s=t^2, g=u^3+7, and simplifying x1=-(x2+u) we get:
     *
     * - Let c0 = ...
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - Let s = t^2
     * - Let g = u^3+7
     * - If g+s = 0, set t = 2*t, s = 4*s
     * - Let X = (g-s)/(2*t).
     * - Let Y = (X+t)/(c0*u) = (g+s)/(2*c0*t*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Now substitute Y^2 = -(g+s)^2/(12*s*u^2) and X/Y = c0*u*(g-s)/(g+s). This
     * means X and Y do not need to be evaluated explicitly anymore.
     *
     * - ...
     * - If g+s = 0, set s = 4*s.
     * - If x3 = u-(g+s)^2/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = (-c0*u*(g-s)/(g+s)-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Simplifying x2 using 2 additional constants:
     *
     * - Let c1 = (c0-1)/2 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = (-c0-1)/2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - ...
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - ...
     *
     * Writing x3 as a fraction:
     *
     * - ...
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) ...
     * - ...

     * Overall, we get:
     *
     * - Let c1 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - If u = 0, set u = 1.
     * - If t = 0, set s = 1, else set s = t^2.
     * - Let g = u^3+7.
     * - If g+s = 0, set s = 4*s.
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     */
    secp256k1_fe u1, s, g, p, d, n, l;
    u1 = *u;
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&u1), 0)) u1 = secp256k1_fe_one;
    secp256k1_fe_sqr(&s, t);
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(t), 0)) s = secp256k1_fe_one;
    secp256k1_fe_sqr(&l, &u1);                                   /* l = u^2 */
    secp256k1_fe_mul(&g, &l, &u1);                               /* g = u^3 */
    secp256k1_fe_add_int(&g, SECP256K1_B);                       /* g = u^3 + 7 */
    p = g;                                                       /* p = g */
    secp256k1_fe_add(&p, &s);                                    /* p = g+s */
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&p), 0)) {
        secp256k1_fe_mul_int(&s, 4);
        /* Recompute p = g+s */
        p = g;                                                   /* p = g */
        secp256k1_fe_add(&p, &s);                                /* p = g+s */
    }
    secp256k1_fe_mul(&d, &s, &l);                                /* d = s*u^2 */
    secp256k1_fe_mul_int(&d, 3);                                 /* d = 3*s*u^2 */
    secp256k1_fe_sqr(&l, &p);                                    /* l = (g+s)^2 */
    secp256k1_fe_negate(&l, &l, 1);                              /* l = -(g+s)^2 */
    secp256k1_fe_mul(&n, &d, &u1);                               /* n = 3*s*u^3 */
    secp256k1_fe_add(&n, &l);                                    /* n = 3*s*u^3-(g+s)^2 */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &d)) {
        /* Return x3 = n/d = (3*s*u^3-(g+s)^2)/(3*s*u^2) */
        *xn = n;
        *xd = d;
        return;
    }
    *xd = p;
    secp256k1_fe_mul(&l, &secp256k1_ellswift_c1, &s);            /* l = c1*s */
    secp256k1_fe_mul(&n, &secp256k1_ellswift_c2, &g);            /* n = c2*g */
    secp256k1_fe_add(&n, &l);                                    /* n = c1*s+c2*g */
    secp256k1_fe_mul(&n, &n, &u1);                               /* n = u*(c1*s+c2*g) */
    /* Possible optimization: in the invocation below, p^2 = (g+s)^2 is computed,
     * which we already have computed above. This could be deduplicated. */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &p)) {
        /* Return x2 = n/p = u*(c1*s+c2*g)/(g+s) */
        *xn = n;
        return;
    }
    secp256k1_fe_mul(&l, &p, &u1);                               /* l = u*(g+s) */
    secp256k1_fe_add(&n, &l);                                    /* n = u*(c1*s+c2*g)+u*(g+s) */
    secp256k1_fe_negate(xn, &n, 2);                              /* n = -u*(c1*s+c2*g)-u*(g+s) */

    VERIFY_CHECK(secp256k1_ge_x_frac_on_curve_var(xn, &p));
    /* Return x3 = n/p = -(u*(c1*s+c2*g)/(g+s)+u) */
}